

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O0

void __thiscall script_tests::script_PushData::test_method(script_PushData *this)

{
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first_00;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first_01;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  bool bVar1;
  long in_FS_OFFSET;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  stack_ignore;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pushdata4_trunc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pushdata2_trunc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pushdata1_trunc;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  pushdata4Stack;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  pushdata2Stack;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  pushdata1Stack;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  directStack;
  ScriptError err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff318;
  lazy_ostream *in_stack_fffffffffffff320;
  char *in_stack_fffffffffffff328;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffff330;
  undefined4 in_stack_fffffffffffff338;
  SigVersion in_stack_fffffffffffff33c;
  undefined7 in_stack_fffffffffffff340;
  undefined1 in_stack_fffffffffffff347;
  lazy_ostream *in_stack_fffffffffffff348;
  const_string *in_stack_fffffffffffff350;
  const_string *pcVar2;
  undefined7 in_stack_fffffffffffff358;
  undefined1 in_stack_fffffffffffff35f;
  iterator in_stack_fffffffffffff360;
  size_type in_stack_fffffffffffff368;
  undefined8 in_stack_fffffffffffff4e8;
  lazy_ostream local_9dc;
  undefined1 local_9c8 [64];
  const_string local_988 [2];
  lazy_ostream local_968 [2];
  undefined8 local_948;
  assertion_result local_940 [2];
  lazy_ostream local_904;
  undefined1 local_8f0 [64];
  const_string local_8b0 [2];
  lazy_ostream local_890 [2];
  undefined8 local_870;
  assertion_result local_868 [2];
  lazy_ostream local_82c;
  undefined1 local_818 [64];
  const_string local_7d8 [2];
  lazy_ostream local_7b8 [2];
  undefined8 local_798;
  assertion_result local_790 [7];
  const_string local_6e0;
  lazy_ostream local_6d0 [2];
  assertion_result local_6b0 [2];
  const_string local_678 [2];
  lazy_ostream local_658 [2];
  assertion_result local_638 [2];
  const_string local_600 [2];
  lazy_ostream local_5e0 [2];
  undefined8 local_5c0;
  assertion_result local_5b8 [3];
  const_string local_568;
  lazy_ostream local_558 [2];
  assertion_result local_538 [2];
  const_string local_500 [2];
  lazy_ostream local_4e0 [2];
  assertion_result local_4c0 [2];
  const_string local_488 [2];
  lazy_ostream local_468 [2];
  undefined8 local_448;
  assertion_result local_440 [3];
  const_string local_3f0;
  lazy_ostream local_3e0 [2];
  assertion_result local_3c0 [2];
  const_string local_388 [2];
  lazy_ostream local_368 [2];
  assertion_result local_348 [2];
  const_string local_310 [2];
  lazy_ostream local_2f0 [2];
  undefined8 local_2d0;
  assertion_result local_2c8 [3];
  const_string local_278;
  lazy_ostream local_268 [2];
  assertion_result local_248 [2];
  const_string local_210 [2];
  lazy_ostream local_1f0 [2];
  undefined8 local_1d0;
  assertion_result local_1c8 [3];
  undefined1 local_178 [6];
  undefined1 local_172;
  undefined1 local_171;
  undefined1 local_170;
  undefined1 local_16f;
  undefined1 local_16e;
  undefined1 local_16d;
  undefined1 local_16c;
  undefined1 local_16b;
  undefined1 local_16a;
  undefined1 local_169;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)in_stack_fffffffffffff318);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),
               in_stack_fffffffffffff350,(size_t)in_stack_fffffffffffff348,
               (const_string *)CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340));
    CScript::CScript<const_unsigned_char_*>
              ((CScript *)in_stack_fffffffffffff328,(uchar *)in_stack_fffffffffffff320,
               (uchar *)in_stack_fffffffffffff318);
    local_1d0 = 0;
    BaseSignatureChecker::BaseSignatureChecker((BaseSignatureChecker *)in_stack_fffffffffffff318);
    EvalScript((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),
               (CScript *)in_stack_fffffffffffff350,(uint)((ulong)in_stack_fffffffffffff348 >> 0x20)
               ,(BaseSignatureChecker *)
                CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340),
               in_stack_fffffffffffff33c,(ScriptError *)in_stack_fffffffffffff330._M_current);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff328,
               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff320,(basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    in_stack_fffffffffffff318 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1c8,local_1f0,local_210,0x3c3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff318);
    BaseSignatureChecker::~BaseSignatureChecker((BaseSignatureChecker *)in_stack_fffffffffffff318);
    CScript::~CScript((CScript *)in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),
               in_stack_fffffffffffff350,(size_t)in_stack_fffffffffffff348,
               (const_string *)CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff328,
               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    ScriptErrorString_abi_cxx11_((ScriptError)((ulong)in_stack_fffffffffffff4e8 >> 0x20));
    boost::unit_test::operator<<(in_stack_fffffffffffff320,in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    in_stack_fffffffffffff318 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_248,local_268,&local_278,0x3c4,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_fffffffffffff318);
    std::__cxx11::string::~string(in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)in_stack_fffffffffffff318);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),
               in_stack_fffffffffffff350,(size_t)in_stack_fffffffffffff348,
               (const_string *)CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340));
    CScript::CScript<const_unsigned_char_*>
              ((CScript *)in_stack_fffffffffffff328,(uchar *)in_stack_fffffffffffff320,
               (uchar *)in_stack_fffffffffffff318);
    local_2d0 = 0;
    BaseSignatureChecker::BaseSignatureChecker((BaseSignatureChecker *)in_stack_fffffffffffff318);
    EvalScript((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),
               (CScript *)in_stack_fffffffffffff350,(uint)((ulong)in_stack_fffffffffffff348 >> 0x20)
               ,(BaseSignatureChecker *)
                CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340),
               in_stack_fffffffffffff33c,(ScriptError *)in_stack_fffffffffffff330._M_current);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff328,
               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff320,(basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    in_stack_fffffffffffff318 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2c8,local_2f0,local_310,0x3c7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff318);
    BaseSignatureChecker::~BaseSignatureChecker((BaseSignatureChecker *)in_stack_fffffffffffff318);
    CScript::~CScript((CScript *)in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),
               in_stack_fffffffffffff350,(size_t)in_stack_fffffffffffff348,
               (const_string *)CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340));
    std::operator==((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)in_stack_fffffffffffff348,
                    (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff328,
               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff320,(basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    in_stack_fffffffffffff318 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_348,local_368,local_388,0x3c8,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),
               in_stack_fffffffffffff350,(size_t)in_stack_fffffffffffff348,
               (const_string *)CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff328,
               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    ScriptErrorString_abi_cxx11_((ScriptError)((ulong)in_stack_fffffffffffff4e8 >> 0x20));
    boost::unit_test::operator<<(in_stack_fffffffffffff320,in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    in_stack_fffffffffffff318 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_3c0,local_3e0,&local_3f0,0x3c9,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_fffffffffffff318);
    std::__cxx11::string::~string(in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)in_stack_fffffffffffff318);
  do {
    pcVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),
               in_stack_fffffffffffff350,(size_t)in_stack_fffffffffffff348,
               (const_string *)CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340));
    CScript::CScript<const_unsigned_char_*>
              ((CScript *)in_stack_fffffffffffff328,(uchar *)in_stack_fffffffffffff320,
               (uchar *)in_stack_fffffffffffff318);
    local_448 = 0;
    BaseSignatureChecker::BaseSignatureChecker((BaseSignatureChecker *)in_stack_fffffffffffff318);
    EvalScript((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),
               (CScript *)in_stack_fffffffffffff350,(uint)((ulong)in_stack_fffffffffffff348 >> 0x20)
               ,(BaseSignatureChecker *)
                CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340),
               in_stack_fffffffffffff33c,(ScriptError *)in_stack_fffffffffffff330._M_current);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff328,
               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff320,(basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    in_stack_fffffffffffff318 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_440,local_468,local_488,0x3cc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff318);
    BaseSignatureChecker::~BaseSignatureChecker((BaseSignatureChecker *)in_stack_fffffffffffff318);
    CScript::~CScript((CScript *)in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),
               in_stack_fffffffffffff350,(size_t)in_stack_fffffffffffff348,
               (const_string *)CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340));
    std::operator==((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)in_stack_fffffffffffff348,
                    (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff328,
               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff320,(basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    in_stack_fffffffffffff318 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4c0,local_4e0,local_500,0x3cd,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),
               in_stack_fffffffffffff350,(size_t)in_stack_fffffffffffff348,
               (const_string *)CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff328,
               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    ScriptErrorString_abi_cxx11_((ScriptError)((ulong)pcVar2 >> 0x20));
    boost::unit_test::operator<<(in_stack_fffffffffffff320,in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    in_stack_fffffffffffff318 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_538,local_558,&local_568,0x3ce,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_fffffffffffff318);
    std::__cxx11::string::~string(in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)in_stack_fffffffffffff318);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),
               in_stack_fffffffffffff350,(size_t)in_stack_fffffffffffff348,
               (const_string *)CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340));
    CScript::CScript<const_unsigned_char_*>
              ((CScript *)in_stack_fffffffffffff328,(uchar *)in_stack_fffffffffffff320,
               (uchar *)in_stack_fffffffffffff318);
    local_5c0 = 0;
    BaseSignatureChecker::BaseSignatureChecker((BaseSignatureChecker *)in_stack_fffffffffffff318);
    EvalScript((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),
               (CScript *)in_stack_fffffffffffff350,(uint)((ulong)in_stack_fffffffffffff348 >> 0x20)
               ,(BaseSignatureChecker *)
                CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340),
               in_stack_fffffffffffff33c,(ScriptError *)in_stack_fffffffffffff330._M_current);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff328,
               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff320,(basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    in_stack_fffffffffffff318 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_5b8,local_5e0,local_600,0x3d1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff318);
    BaseSignatureChecker::~BaseSignatureChecker((BaseSignatureChecker *)in_stack_fffffffffffff318);
    CScript::~CScript((CScript *)in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),
               in_stack_fffffffffffff350,(size_t)in_stack_fffffffffffff348,
               (const_string *)CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340));
    std::operator==((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)in_stack_fffffffffffff348,
                    (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff328,
               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff320,(basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    in_stack_fffffffffffff318 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_638,local_658,local_678,0x3d2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),
               in_stack_fffffffffffff350,(size_t)in_stack_fffffffffffff348,
               (const_string *)CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff328,
               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    ScriptErrorString_abi_cxx11_((ScriptError)((ulong)pcVar2 >> 0x20));
    boost::unit_test::operator<<(in_stack_fffffffffffff320,in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    in_stack_fffffffffffff318 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_6b0,local_6d0,&local_6e0,0x3d3,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_fffffffffffff318);
    std::__cxx11::string::~string(in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_16a = 0x4c;
  local_169 = 1;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff318);
  __l._M_len = in_stack_fffffffffffff368;
  __l._M_array = in_stack_fffffffffffff360;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),__l,
             (allocator_type *)in_stack_fffffffffffff350);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff318);
  local_16d = 0x4d;
  local_16c = 1;
  local_16b = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff318);
  __l_00._M_len = in_stack_fffffffffffff368;
  __l_00._M_array = in_stack_fffffffffffff360;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),__l_00,
             (allocator_type *)in_stack_fffffffffffff350);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff318);
  local_172 = 0x4e;
  local_171 = 1;
  local_170 = 0;
  local_16f = 0;
  local_16e = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff318);
  __l_01._M_len = in_stack_fffffffffffff368;
  __l_01._M_array = in_stack_fffffffffffff360;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),__l_01,
             (allocator_type *)in_stack_fffffffffffff350);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff318);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)in_stack_fffffffffffff318);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),
               in_stack_fffffffffffff350,(size_t)in_stack_fffffffffffff348,
               (const_string *)CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff320);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff320);
    first._M_current._4_4_ = in_stack_fffffffffffff33c;
    first._M_current._0_4_ = in_stack_fffffffffffff338;
    CScript::
    CScript<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ((CScript *)in_stack_fffffffffffff318,first,in_stack_fffffffffffff330);
    local_798 = 0;
    BaseSignatureChecker::BaseSignatureChecker((BaseSignatureChecker *)in_stack_fffffffffffff318);
    EvalScript((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),
               (CScript *)in_stack_fffffffffffff350,(uint)((ulong)in_stack_fffffffffffff348 >> 0x20)
               ,(BaseSignatureChecker *)
                CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340),
               in_stack_fffffffffffff33c,(ScriptError *)in_stack_fffffffffffff330._M_current);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff328,
               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff320,(basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    in_stack_fffffffffffff318 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_790,local_7b8,local_7d8,0x3da,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff318);
    BaseSignatureChecker::~BaseSignatureChecker((BaseSignatureChecker *)in_stack_fffffffffffff318);
    CScript::~CScript((CScript *)in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),
               in_stack_fffffffffffff350,(size_t)in_stack_fffffffffffff348,
               (const_string *)CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff320,(char (*) [1])in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    local_82c._vptr_lazy_ostream._0_4_ = 0xf;
    in_stack_fffffffffffff328 = "SCRIPT_ERR_BAD_OPCODE";
    in_stack_fffffffffffff320 = &local_82c;
    in_stack_fffffffffffff318 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e7b339;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ScriptError_t,ScriptError_t>
              (local_818,(undefined1 *)((long)&local_82c._vptr_lazy_ostream + 4),0x3db,1,2,local_178
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),
               in_stack_fffffffffffff350,(size_t)in_stack_fffffffffffff348,
               (const_string *)CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff320);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff320);
    first_00._M_current._4_4_ = in_stack_fffffffffffff33c;
    first_00._M_current._0_4_ = in_stack_fffffffffffff338;
    CScript::
    CScript<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ((CScript *)in_stack_fffffffffffff318,first_00,in_stack_fffffffffffff330);
    local_870 = 0;
    BaseSignatureChecker::BaseSignatureChecker((BaseSignatureChecker *)in_stack_fffffffffffff318);
    EvalScript((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),
               (CScript *)in_stack_fffffffffffff350,(uint)((ulong)in_stack_fffffffffffff348 >> 0x20)
               ,(BaseSignatureChecker *)
                CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340),
               in_stack_fffffffffffff33c,(ScriptError *)in_stack_fffffffffffff330._M_current);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff328,
               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff320,(basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    in_stack_fffffffffffff318 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_868,local_890,local_8b0,0x3dc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff318);
    BaseSignatureChecker::~BaseSignatureChecker((BaseSignatureChecker *)in_stack_fffffffffffff318);
    CScript::~CScript((CScript *)in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),
               in_stack_fffffffffffff350,(size_t)in_stack_fffffffffffff348,
               (const_string *)CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff320,(char (*) [1])in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    local_904._vptr_lazy_ostream._0_4_ = 0xf;
    in_stack_fffffffffffff328 = "SCRIPT_ERR_BAD_OPCODE";
    in_stack_fffffffffffff320 = &local_904;
    in_stack_fffffffffffff318 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e7b339;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ScriptError_t,ScriptError_t>
              (local_8f0,(undefined1 *)((long)&local_904._vptr_lazy_ostream + 4),0x3dd,1,2,local_178
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff318);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),
               in_stack_fffffffffffff350,(size_t)in_stack_fffffffffffff348,
               (const_string *)CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff320);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff320);
    first_01._M_current._4_4_ = in_stack_fffffffffffff33c;
    first_01._M_current._0_4_ = in_stack_fffffffffffff338;
    CScript::
    CScript<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ((CScript *)in_stack_fffffffffffff318,first_01,in_stack_fffffffffffff330);
    local_948 = 0;
    BaseSignatureChecker::BaseSignatureChecker((BaseSignatureChecker *)in_stack_fffffffffffff318);
    EvalScript((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),
               (CScript *)in_stack_fffffffffffff350,(uint)((ulong)in_stack_fffffffffffff348 >> 0x20)
               ,(BaseSignatureChecker *)
                CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340),
               in_stack_fffffffffffff33c,(ScriptError *)in_stack_fffffffffffff330._M_current);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff328,
               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff320,(basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    in_stack_fffffffffffff318 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_940,local_968,local_988,0x3de,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff318);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff318);
    BaseSignatureChecker::~BaseSignatureChecker((BaseSignatureChecker *)in_stack_fffffffffffff318);
    CScript::~CScript((CScript *)in_stack_fffffffffffff318);
    in_stack_fffffffffffff35f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff35f);
  do {
    pcVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff318);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff35f,in_stack_fffffffffffff358),
               pcVar2,(size_t)in_stack_fffffffffffff348,
               (const_string *)CONCAT17(in_stack_fffffffffffff347,in_stack_fffffffffffff340));
    in_stack_fffffffffffff348 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff320,(char (*) [1])in_stack_fffffffffffff318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328,
               (pointer)in_stack_fffffffffffff320,(unsigned_long)in_stack_fffffffffffff318);
    local_9dc._vptr_lazy_ostream._0_4_ = 0xf;
    in_stack_fffffffffffff328 = "SCRIPT_ERR_BAD_OPCODE";
    in_stack_fffffffffffff320 = &local_9dc;
    in_stack_fffffffffffff318 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e7b339;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ScriptError_t,ScriptError_t>
              (local_9c8,(undefined1 *)((long)&local_9dc._vptr_lazy_ostream + 4),0x3df,1,2,local_178
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff318);
    in_stack_fffffffffffff347 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff347);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)in_stack_fffffffffffff328);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff328);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff328);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff328);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)in_stack_fffffffffffff328);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)in_stack_fffffffffffff328);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)in_stack_fffffffffffff328);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)in_stack_fffffffffffff328);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(script_PushData)
{
    // Check that PUSHDATA1, PUSHDATA2, and PUSHDATA4 create the same value on
    // the stack as the 1-75 opcodes do.
    static const unsigned char direct[] = { 1, 0x5a };
    static const unsigned char pushdata1[] = { OP_PUSHDATA1, 1, 0x5a };
    static const unsigned char pushdata2[] = { OP_PUSHDATA2, 1, 0, 0x5a };
    static const unsigned char pushdata4[] = { OP_PUSHDATA4, 1, 0, 0, 0, 0x5a };

    ScriptError err;
    std::vector<std::vector<unsigned char> > directStack;
    BOOST_CHECK(EvalScript(directStack, CScript(direct, direct + sizeof(direct)), SCRIPT_VERIFY_P2SH, BaseSignatureChecker(), SigVersion::BASE, &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));

    std::vector<std::vector<unsigned char> > pushdata1Stack;
    BOOST_CHECK(EvalScript(pushdata1Stack, CScript(pushdata1, pushdata1 + sizeof(pushdata1)), SCRIPT_VERIFY_P2SH, BaseSignatureChecker(), SigVersion::BASE, &err));
    BOOST_CHECK(pushdata1Stack == directStack);
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));

    std::vector<std::vector<unsigned char> > pushdata2Stack;
    BOOST_CHECK(EvalScript(pushdata2Stack, CScript(pushdata2, pushdata2 + sizeof(pushdata2)), SCRIPT_VERIFY_P2SH, BaseSignatureChecker(), SigVersion::BASE, &err));
    BOOST_CHECK(pushdata2Stack == directStack);
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));

    std::vector<std::vector<unsigned char> > pushdata4Stack;
    BOOST_CHECK(EvalScript(pushdata4Stack, CScript(pushdata4, pushdata4 + sizeof(pushdata4)), SCRIPT_VERIFY_P2SH, BaseSignatureChecker(), SigVersion::BASE, &err));
    BOOST_CHECK(pushdata4Stack == directStack);
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));

    const std::vector<unsigned char> pushdata1_trunc{OP_PUSHDATA1, 1};
    const std::vector<unsigned char> pushdata2_trunc{OP_PUSHDATA2, 1, 0};
    const std::vector<unsigned char> pushdata4_trunc{OP_PUSHDATA4, 1, 0, 0, 0};

    std::vector<std::vector<unsigned char>> stack_ignore;
    BOOST_CHECK(!EvalScript(stack_ignore, CScript(pushdata1_trunc.begin(), pushdata1_trunc.end()), SCRIPT_VERIFY_P2SH, BaseSignatureChecker(), SigVersion::BASE, &err));
    BOOST_CHECK_EQUAL(err, SCRIPT_ERR_BAD_OPCODE);
    BOOST_CHECK(!EvalScript(stack_ignore, CScript(pushdata2_trunc.begin(), pushdata2_trunc.end()), SCRIPT_VERIFY_P2SH, BaseSignatureChecker(), SigVersion::BASE, &err));
    BOOST_CHECK_EQUAL(err, SCRIPT_ERR_BAD_OPCODE);
    BOOST_CHECK(!EvalScript(stack_ignore, CScript(pushdata4_trunc.begin(), pushdata4_trunc.end()), SCRIPT_VERIFY_P2SH, BaseSignatureChecker(), SigVersion::BASE, &err));
    BOOST_CHECK_EQUAL(err, SCRIPT_ERR_BAD_OPCODE);
}